

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_certificate.cc
# Opt level: O0

bool __thiscall bssl::ParseExtension(bssl *this,Input extension_tlv,ParsedExtension *out)

{
  Input in;
  Input input;
  bool bVar1;
  undefined1 local_80 [8];
  Input critical;
  undefined1 local_68 [7];
  bool has_critical;
  Parser extension_parser;
  undefined1 local_40 [8];
  Parser parser;
  ParsedExtension *out_local;
  Input extension_tlv_local;
  
  parser.advance_len_ = extension_tlv.data_.size_;
  input.data_.size_ = (size_t)extension_tlv.data_.data_;
  input.data_.data_ = (uchar *)this;
  extension_parser.advance_len_ = (size_t)this;
  der::Parser::Parser((Parser *)local_40,input);
  der::Parser::Parser((Parser *)local_68);
  bVar1 = der::Parser::ReadSequence((Parser *)local_40,(Parser *)local_68);
  if (bVar1) {
    bVar1 = der::Parser::ReadTag((Parser *)local_68,6,(Input *)parser.advance_len_);
    if (bVar1) {
      *(undefined1 *)(parser.advance_len_ + 0x20) = 0;
      der::Input::Input((Input *)local_80);
      bVar1 = der::Parser::ReadOptionalTag
                        ((Parser *)local_68,1,(Input *)local_80,
                         (bool *)((long)&critical.data_.size_ + 7));
      if (bVar1) {
        if ((critical.data_.size_._7_1_ & 1) != 0) {
          in.data_.size_ = (size_t)critical.data_.data_;
          in.data_.data_ = (uchar *)local_80;
          bVar1 = der::ParseBool(in,(bool *)(parser.advance_len_ + 0x20));
          if (!bVar1) {
            return false;
          }
          if ((*(byte *)(parser.advance_len_ + 0x20) & 1) == 0) {
            return false;
          }
        }
        bVar1 = der::Parser::ReadTag((Parser *)local_68,4,(Input *)(parser.advance_len_ + 0x10));
        if (bVar1) {
          bVar1 = der::Parser::HasMore((Parser *)local_68);
          if (bVar1) {
            extension_tlv_local.data_.size_._7_1_ = false;
          }
          else {
            bVar1 = der::Parser::HasMore((Parser *)local_40);
            if (bVar1) {
              extension_tlv_local.data_.size_._7_1_ = false;
            }
            else {
              extension_tlv_local.data_.size_._7_1_ = true;
            }
          }
        }
        else {
          extension_tlv_local.data_.size_._7_1_ = false;
        }
      }
      else {
        extension_tlv_local.data_.size_._7_1_ = false;
      }
    }
    else {
      extension_tlv_local.data_.size_._7_1_ = false;
    }
  }
  else {
    extension_tlv_local.data_.size_._7_1_ = false;
  }
  return extension_tlv_local.data_.size_._7_1_;
}

Assistant:

bool ParseExtension(der::Input extension_tlv, ParsedExtension *out) {
  der::Parser parser(extension_tlv);

  //    Extension  ::=  SEQUENCE  {
  der::Parser extension_parser;
  if (!parser.ReadSequence(&extension_parser)) {
    return false;
  }

  //            extnID      OBJECT IDENTIFIER,
  if (!extension_parser.ReadTag(CBS_ASN1_OBJECT, &out->oid)) {
    return false;
  }

  //            critical    BOOLEAN DEFAULT FALSE,
  out->critical = false;
  bool has_critical;
  der::Input critical;
  if (!extension_parser.ReadOptionalTag(CBS_ASN1_BOOLEAN, &critical,
                                        &has_critical)) {
    return false;
  }
  if (has_critical) {
    if (!der::ParseBool(critical, &out->critical)) {
      return false;
    }
    if (!out->critical) {
      return false;  // DER-encoding requires DEFAULT values be omitted.
    }
  }

  //            extnValue   OCTET STRING
  if (!extension_parser.ReadTag(CBS_ASN1_OCTETSTRING, &out->value)) {
    return false;
  }

  // The Extension type does not have an extension point (everything goes in
  // extnValue).
  if (extension_parser.HasMore()) {
    return false;
  }

  // By definition the input was a single Extension sequence, so there shouldn't
  // be unconsumed data.
  if (parser.HasMore()) {
    return false;
  }

  return true;
}